

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
MuteGameCommand::trigger
          (MuteGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  PlayerInfo *pPVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  undefined8 uStack_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  local_a8._M_dataplus._M_p = (pointer)parameters._M_len;
  local_88._M_dataplus._M_p = (pointer)0x2;
  local_88._M_string_length = 0x13bb6d;
  local_a8._M_string_length = (size_type)args_2;
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&split_parameters,(basic_string_view<char,_std::char_traits<char>_> *)&local_a8,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_88);
  if (split_parameters.first._M_len == 0) {
    pcVar2 = "Error: Too few parameters. Syntax: mute <player> [Reason]";
    uStack_c0 = 0x39;
  }
  else {
    local_b8._M_len =
         CONCAT44(split_parameters.second._M_len._4_4_,(undefined4)split_parameters.second._M_len);
    local_b8._M_str =
         (char *)CONCAT44(split_parameters.second._M_str._4_4_,split_parameters.second._M_str._0_4_)
    ;
    if (local_b8._M_len == 0) {
      local_b8._M_len = 9;
      local_b8._M_str = "No reason";
    }
    pPVar1 = (PlayerInfo *)
             RenX::Server::getPlayerByPartName
                       (source,split_parameters.first._M_len,split_parameters.first._M_str);
    if (pPVar1 == (PlayerInfo *)0x0) {
      pcVar2 = "Error: Player not found.";
      uStack_c0 = 0x18;
    }
    else {
      if (pPVar1 == player) {
        pcVar2 = "Error: You cannot mute yourself.";
      }
      else {
        if (player->access <= pPVar1->access) {
          local_88._M_dataplus._M_p = (pointer)0x25;
          local_88._M_string_length = 0x13e7ad;
          local_68._M_dataplus._M_p = (pointer)pluginInstance.m_staffTitle._M_string_length;
          local_68._M_string_length = (size_type)pluginInstance.m_staffTitle._M_dataplus._M_p;
          local_48._M_len = 2;
          local_48._M_str = "s.";
          jessilib::
          join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                    (&local_a8,(jessilib *)&local_88,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_68,&local_48,args_2)
          ;
          RenX::Server::sendMessage
                    (source,player,local_a8._M_string_length,local_a8._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_a8);
          return;
        }
        RenX::Server::mute((PlayerInfo *)source);
        s_abi_cxx11_(&local_88,"You have been muted for: ",0x19);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_68,&local_b8,(allocator<char> *)&local_48);
        std::operator+(&local_a8,&local_88,&local_68);
        RenX::Server::sendMessage(source,pPVar1,local_a8._M_string_length,local_a8._M_dataplus._M_p)
        ;
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        pcVar2 = "Player has been muted from chat.";
      }
      uStack_c0 = 0x20;
    }
  }
  RenX::Server::sendMessage(source,player,uStack_c0,pcVar2);
  return;
}

Assistant:

void MuteGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view reason = split_parameters.second;
		if (reason.empty()) {
			reason = "No reason"sv;
		}
		RenX::PlayerInfo *target = source->getPlayerByPartName(split_parameters.first);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You cannot mute yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not mute higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else
		{
			source->mute(*target);
			source->sendMessage(*target, "You have been muted for: "s + std::string{reason});
			source->sendMessage(*player, "Player has been muted from chat."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: mute <player> [Reason]"sv);
}